

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_enum.cc
# Opt level: O3

char * i2s_ASN1_ENUMERATED_TABLE(X509V3_EXT_METHOD *meth,ASN1_ENUMERATED *aint)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  char *pcVar4;
  long *plVar5;
  
  lVar3 = ASN1_ENUMERATED_get(aint);
  piVar2 = (int *)meth->usr_data;
  pcVar4 = *(char **)(piVar2 + 2);
  if (pcVar4 != (char *)0x0) {
    if (lVar3 != *piVar2) {
      plVar5 = (long *)(piVar2 + 8);
      do {
        pcVar4 = (char *)*plVar5;
        if (pcVar4 == (char *)0x0) goto LAB_00228520;
        plVar1 = plVar5 + -1;
        plVar5 = plVar5 + 3;
      } while (lVar3 != (int)*plVar1);
    }
    pcVar4 = OPENSSL_strdup(pcVar4);
    return pcVar4;
  }
LAB_00228520:
  pcVar4 = i2s_ASN1_ENUMERATED(meth,aint);
  return pcVar4;
}

Assistant:

static char *i2s_ASN1_ENUMERATED_TABLE(const X509V3_EXT_METHOD *method,
                                       void *ext) {
  const ASN1_ENUMERATED *e = reinterpret_cast<const ASN1_ENUMERATED *>(ext);
  long strval = ASN1_ENUMERATED_get(e);
  for (const ENUMERATED_NAMES *enam =
           reinterpret_cast<const ENUMERATED_NAMES *>(method->usr_data);
       enam->lname; enam++) {
    if (strval == enam->bitnum) {
      return OPENSSL_strdup(enam->lname);
    }
  }
  return i2s_ASN1_ENUMERATED(method, e);
}